

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::_::HashSetCallbacks>::
insert<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char_const>&>
          (HashIndex<kj::_::HashSetCallbacks> *this,
          ArrayPtr<kj::ArrayPtr<const_unsigned_char>_> table,size_t pos,
          ArrayPtr<const_unsigned_char> *params)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  HashBucket *pHVar7;
  HashIndex<kj::_::HashSetCallbacks> *this_00;
  ulong targetSize;
  ArrayPtr<const_unsigned_char> *in_R9;
  long lVar8;
  HashBucket *pHVar9;
  size_t sVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = (HashIndex<kj::_::HashSetCallbacks> *)table.ptr;
  uVar4 = (this_00->buckets).size_ * 2;
  if (uVar4 < (this_00->erasedCount + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar4) {
      targetSize = uVar4;
    }
    rehash(this_00,targetSize);
  }
  uVar5 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,*in_R9);
  uVar6 = kj::_::chooseBucket((uint)(uVar5 != 0),(uint)(this_00->buckets).size_);
  aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)(this_00->buckets).ptr;
  sVar3 = in_R9->size_;
  pHVar7 = (HashBucket *)0x0;
  do {
    pHVar9 = (HashBucket *)(aVar2.value + (ulong)uVar6 * 8);
    uVar1 = pHVar9->value;
    if (uVar1 == 1) {
      if (pHVar7 == (HashBucket *)0x0) {
        pHVar7 = pHVar9;
      }
    }
    else {
      if (uVar1 == 0) {
        if (pHVar7 != (HashBucket *)0x0) {
          this_00->erasedCount = this_00->erasedCount - 1;
          pHVar9 = pHVar7;
        }
        *pHVar9 = (HashBucket)(((ulong)(uVar5 != 0) | (long)params << 0x20) + 0x200000000);
        *(undefined1 *)this = 0;
LAB_00214d94:
        MVar11.ptr.field_1.value = aVar2.value;
        MVar11.ptr._0_8_ = this;
        return (Maybe<unsigned_long>)MVar11.ptr;
      }
      if (pHVar9->hash == (uint)(uVar5 != 0)) {
        lVar8 = (ulong)(uVar1 - 2) * 0x10;
        if (*(size_t *)(table.size_ + 8 + lVar8) == sVar3) {
          if (sVar3 == 0) {
LAB_00214d56:
            *(undefined1 *)this = 1;
            this->erasedCount = (ulong)(uVar1 - 2);
            goto LAB_00214d94;
          }
          sVar10 = 0;
          while (*(uchar *)(*(long *)(lVar8 + table.size_) + sVar10) == in_R9->ptr[sVar10]) {
            sVar10 = sVar10 + 1;
            if (sVar3 == sVar10) goto LAB_00214d56;
          }
        }
      }
    }
    sVar10 = (ulong)uVar6 + 1;
    uVar6 = (uint)sVar10;
    if (sVar10 == (this_00->buckets).size_) {
      uVar6 = 0;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }